

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_wipe_x11(wchar_t x,wchar_t y,wchar_t n)

{
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  Infoclr = clr[0];
  Infofnt_text_non(x,y,L"",n);
  return 0;
}

Assistant:

static errr Term_wipe_x11(int x, int y, int n)
{
	/* Erase (use black) */
	Infoclr_set(clr[COLOUR_DARK]);

	/* Mega-Hack -- Erase some space */
	Infofnt_text_non(x, y, L"", n);

	/* Success */
	return (0);
}